

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkBase.cpp
# Opt level: O1

void __thiscall chrono::ChLinkBase::ArchiveOUT(ChLinkBase *this,ChArchiveOut *marchive)

{
  char *local_38;
  undefined1 *local_30;
  undefined1 local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChLinkBase>(marchive);
  ChPhysicsItem::ArchiveOUT(&this->super_ChPhysicsItem,marchive);
  local_30 = &(this->super_ChPhysicsItem).field_0x74;
  local_38 = "disabled";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[2])(marchive,&local_38);
  local_30 = &(this->super_ChPhysicsItem).field_0x75;
  local_38 = "valid";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[2])(marchive,&local_38);
  local_30 = &(this->super_ChPhysicsItem).field_0x76;
  local_38 = "broken";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[2])(marchive,&local_38);
  return;
}

Assistant:

void ChLinkBase::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkBase>();

    // serialize parent class
    ChPhysicsItem::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(disabled);
    marchive << CHNVP(valid);
    marchive << CHNVP(broken);
}